

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

void Js::JavascriptString::CopyHelper(char16 *dst,char16 *str,charcount_t countNeeded)

{
  charcount_t countNeeded_local;
  char16 *str_local;
  char16 *dst_local;
  
  switch(countNeeded) {
  case 0:
    break;
  case 1:
    *dst = *str;
    break;
  case 2:
    goto switchD_013201c6_caseD_2;
  case 3:
    dst[2] = str[2];
    goto LAB_01320268;
  case 4:
    goto switchD_013201c6_caseD_4;
  case 5:
    dst[4] = str[4];
    goto LAB_01320258;
  case 6:
    goto switchD_013201c6_caseD_6;
  case 7:
    dst[6] = str[6];
    goto LAB_01320248;
  case 9:
    dst[8] = str[8];
LAB_01320238:
    *(undefined4 *)(dst + 6) = *(undefined4 *)(str + 6);
switchD_013201c6_caseD_6:
LAB_01320248:
    *(undefined4 *)(dst + 4) = *(undefined4 *)(str + 4);
switchD_013201c6_caseD_4:
LAB_01320258:
    *(undefined4 *)(dst + 2) = *(undefined4 *)(str + 2);
switchD_013201c6_caseD_2:
LAB_01320268:
    *(undefined4 *)dst = *(undefined4 *)str;
    break;
  case 10:
    *(undefined4 *)(dst + 8) = *(undefined4 *)(str + 8);
  case 8:
    goto LAB_01320238;
  default:
    js_wmemcpy_s(dst,(ulong)countNeeded,str,(ulong)countNeeded);
  }
  return;
}

Assistant:

void JavascriptString::CopyHelper(__out_ecount(countNeeded) char16 *dst, __in_ecount(countNeeded) const char16 * str, charcount_t countNeeded)
    {
        switch(countNeeded)
        {
        case 0:
            return;
        case 1:
            dst[0] = str[0];
            break;
        case 3:
            dst[2] = str[2];
            goto case_2;
        case 5:
            dst[4] = str[4];
            goto case_4;
        case 7:
            dst[6] = str[6];
            goto case_6;
        case 9:
            dst[8] = str[8];
            goto case_8;

        case 10:
            *(uint32 *)(dst+8) = *(uint32*)(str+8);
            // FALLTHROUGH
        case 8:
case_8:
            *(uint32 *)(dst+6) = *(uint32*)(str+6);
            // FALLTHROUGH
        case 6:
case_6:
            *(uint32 *)(dst+4) = *(uint32*)(str+4);
            // FALLTHROUGH
        case 4:
case_4:
            *(uint32 *)(dst+2) = *(uint32*)(str+2);
            // FALLTHROUGH
        case 2:
case_2:
            *(uint32 *)(dst) = *(uint32*)str;
            break;

        default:
            js_wmemcpy_s(dst, countNeeded, str, countNeeded);
        }
    }